

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O2

int __thiscall
glslang::HlslParseContext::findSubtreeOffset
          (HlslParseContext *this,TType *type,int subset,TVector<int> *offsets)

{
  int iVar1;
  TType derefType;
  TType local_c0;
  
  iVar1 = (*type->_vptr_TType[0x1d])(type);
  if (((char)iVar1 == '\0') && (iVar1 = (*type->_vptr_TType[0x25])(type), (char)iVar1 == '\0')) {
    return (offsets->super_vector<int,_glslang::pool_allocator<int>_>).
           super__Vector_base<int,_glslang::pool_allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start[subset];
  }
  TType::TType(&local_c0,type,0,false);
  iVar1 = findSubtreeOffset(this,&local_c0,
                            (offsets->super_vector<int,_glslang::pool_allocator<int>_>).
                            super__Vector_base<int,_glslang::pool_allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start[subset],offsets);
  return iVar1;
}

Assistant:

int HlslParseContext::findSubtreeOffset(const TType& type, int subset, const TVector<int>& offsets) const
{
    if (!type.isArray() && !type.isStruct())
        return offsets[subset];
    TType derefType(type, 0);
    return findSubtreeOffset(derefType, offsets[subset], offsets);
}